

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

void R_RebuildViewInterpolation(player_t *player)

{
  AActor *actor;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  InterpolationViewer *pIVar6;
  
  if ((player != (player_t *)0x0) && (actor = (player->camera).field_0.p, actor != (AActor *)0x0)) {
    if (((actor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (player->camera).field_0.p = (AActor *)0x0;
      return;
    }
    if (NoInterpolateView) {
      NoInterpolateView = false;
      pIVar6 = FindPastViewer(actor);
      dVar1 = (pIVar6->New).Pos.Y;
      dVar2 = (pIVar6->New).Pos.Z;
      dVar3 = (pIVar6->New).Angles.Pitch.Degrees;
      dVar4 = (pIVar6->New).Angles.Yaw.Degrees;
      dVar5 = (pIVar6->New).Angles.Roll.Degrees;
      (pIVar6->Old).Pos.X = (pIVar6->New).Pos.X;
      (pIVar6->Old).Pos.Y = dVar1;
      (pIVar6->Old).Angles.Yaw.Degrees = dVar4;
      (pIVar6->Old).Angles.Roll.Degrees = dVar5;
      (pIVar6->Old).Pos.Z = dVar2;
      (pIVar6->Old).Angles.Pitch.Degrees = dVar3;
      if (InterpolationPath.Count != 0) {
        InterpolationPath.Count = 0;
      }
    }
  }
  return;
}

Assistant:

void R_RebuildViewInterpolation(player_t *player)
{
	if (player == NULL || player->camera == NULL)
		return;

	if (!NoInterpolateView)
		return;
	NoInterpolateView = false;

	InterpolationViewer *iview = FindPastViewer(player->camera);

	iview->Old = iview->New;
	InterpolationPath.Clear();
}